

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.h
# Opt level: O0

Analysis __thiscall
spvtools::opt::DeadInsertElimPass::GetPreservedAnalyses(DeadInsertElimPass *this)

{
  Analysis AVar1;
  DeadInsertElimPass *this_local;
  
  AVar1 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  AVar1 = opt::operator|(AVar1,kAnalysisDecorations);
  AVar1 = opt::operator|(AVar1,kAnalysisCombinators);
  AVar1 = opt::operator|(AVar1,kAnalysisCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisNameMap);
  AVar1 = opt::operator|(AVar1,kAnalysisConstants);
  AVar1 = opt::operator|(AVar1,kAnalysisTypes);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisDecorations | IRContext::kAnalysisCombinators |
           IRContext::kAnalysisCFG | IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisNameMap | IRContext::kAnalysisConstants |
           IRContext::kAnalysisTypes;
  }